

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_tree.cc
# Opt level: O0

void memory_tree_ns::predict(memory_tree *b,single_learner *base,example *ec)

{
  node *pnVar1;
  size_t i;
  example **ppeVar2;
  example *ec1;
  single_learner *in_RDX;
  memory_tree *in_RSI;
  long in_RDI;
  float fVar3;
  v_array<unsigned_int> selected_labs;
  float reward;
  int64_t closest_ec;
  uint32_t newcn;
  uint32_t cn;
  labels preds;
  labels multilabels;
  uint32_t save_multi_pred;
  label_t mc;
  size_t in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  uint32_t in_stack_ffffffffffffff3c;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 uVar4;
  undefined4 in_stack_ffffffffffffff80;
  uint32_t in_stack_ffffffffffffff84;
  uint32_t uVar5;
  undefined4 uVar6;
  uint uVar7;
  memory_tree *in_stack_ffffffffffffff98;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  v_array<unsigned_int> *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 uVar8;
  undefined8 in_stack_ffffffffffffffe0;
  memory_tree *pmVar9;
  
  uVar8 = 0;
  if (*(int *)(in_RDI + 0xcc) == 0) {
    in_stack_ffffffffffffffe0 = *(undefined8 *)(in_RDX + 0x6828);
    uVar8 = *(undefined4 *)(in_RDX + 0x6850);
  }
  else {
    local_48 = *(undefined8 *)(in_RDX + 0x6828);
    local_40 = *(undefined8 *)(in_RDX + 0x6830);
    local_38 = *(undefined8 *)(in_RDX + 0x6838);
    in_stack_ffffffffffffffd0 = *(v_array<unsigned_int> **)(in_RDX + 0x6840);
    in_stack_ffffffffffffff98 = *(memory_tree **)(in_RDX + 0x6850);
    local_60 = *(undefined8 *)(in_RDX + 0x6858);
    local_58 = *(undefined8 *)(in_RDX + 0x6860);
    local_50 = *(undefined8 *)(in_RDX + 0x6868);
  }
  uVar5 = 0x3f800000;
  uVar6 = 0;
  *(undefined8 *)(in_RDX + 0x6828) = 0x3f800000bf800000;
  *(undefined4 *)(in_RDX + 0x6830) = 0;
  uVar7 = 0;
  while (pnVar1 = v_array<memory_tree_ns::node>::operator[]
                            ((v_array<memory_tree_ns::node> *)(in_RDI + 8),(ulong)uVar7),
        pnVar1->internal == 1) {
    pmVar9 = in_RSI;
    v_array<memory_tree_ns::node>::operator[]
              ((v_array<memory_tree_ns::node> *)(in_RDI + 8),(ulong)uVar7);
    LEARNER::learner<char,_example>::predict
              ((learner<char,_example> *)in_RSI,
               (example *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
               in_stack_ffffffffffffff30);
    if (0.0 < *(float *)(in_RDX + 0x6850) || *(float *)(in_RDX + 0x6850) == 0.0) {
      pnVar1 = v_array<memory_tree_ns::node>::operator[]
                         ((v_array<memory_tree_ns::node> *)(in_RDI + 8),(ulong)uVar7);
      in_stack_ffffffffffffff3c = pnVar1->right;
      in_stack_ffffffffffffff84 = in_stack_ffffffffffffff3c;
      uVar7 = in_stack_ffffffffffffff3c;
      in_RSI = pmVar9;
    }
    else {
      pnVar1 = v_array<memory_tree_ns::node>::operator[]
                         ((v_array<memory_tree_ns::node> *)(in_RDI + 8),(ulong)uVar7);
      in_stack_ffffffffffffff3c = pnVar1->left;
      in_stack_ffffffffffffff84 = in_stack_ffffffffffffff3c;
      uVar7 = in_stack_ffffffffffffff3c;
      in_RSI = pmVar9;
    }
  }
  if (*(int *)(in_RDI + 0xcc) == 0) {
    *(undefined8 *)(in_RDX + 0x6828) = in_stack_ffffffffffffffe0;
    *(undefined4 *)(in_RDX + 0x6850) = uVar8;
  }
  else {
    *(memory_tree **)(in_RDX + 0x6850) = in_stack_ffffffffffffff98;
    *(undefined8 *)(in_RDX + 0x6858) = local_60;
    *(undefined8 *)(in_RDX + 0x6860) = local_58;
    *(undefined8 *)(in_RDX + 0x6868) = local_50;
    *(undefined8 *)(in_RDX + 0x6828) = local_48;
    *(undefined8 *)(in_RDX + 0x6830) = local_40;
    *(undefined8 *)(in_RDX + 0x6838) = local_38;
    *(v_array<unsigned_int> **)(in_RDX + 0x6840) = in_stack_ffffffffffffffd0;
  }
  if (*(int *)(in_RDI + 0xcc) == 0) {
    i = pick_nearest(in_stack_ffffffffffffff98,(single_learner *)CONCAT44(uVar7,uVar6),uVar5,
                     (example *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    if (i == 0xffffffffffffffff) {
      *(undefined4 *)(in_RDX + 0x6850) = 0;
    }
    else {
      ppeVar2 = v_array<example_*>::operator[]((v_array<example_*> *)(in_RDI + 0x28),i);
      *(float *)(in_RDX + 0x6850) = ((*ppeVar2)->l).simple.label;
    }
    if (*(int *)(in_RDX + 0x6828) != *(int *)(in_RDX + 0x6850)) {
      *(undefined4 *)(in_RDX + 0x68b0) = *(undefined4 *)(in_RDX + 0x6870);
      *(int *)(in_RDI + 0xa8) = *(int *)(in_RDI + 0xa8) + 1;
    }
  }
  else {
    uVar4 = 0;
    ec1 = (example *)
          pick_nearest(in_stack_ffffffffffffff98,(single_learner *)CONCAT44(uVar7,uVar6),uVar5,
                       (example *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    uVar5 = (uint32_t)((ulong)in_stack_ffffffffffffffe0 >> 0x20);
    if (ec1 != (example *)0xffffffffffffffff) {
      v_array<example_*>::operator[]((v_array<example_*> *)(in_RDI + 0x28),(size_t)ec1);
      fVar3 = F1_score_for_two_examples(ec1,(example *)CONCAT44(uVar4,in_stack_ffffffffffffff70));
      *(float *)(in_RDI + 0xd8) = fVar3 + *(float *)(in_RDI + 0xd8);
    }
    v_init<unsigned_int>();
    uVar5 = compute_hamming_loss_via_oas
                      (in_RSI,in_RDX,uVar5,(example *)CONCAT44(uVar8,in_stack_ffffffffffffffd8),
                       in_stack_ffffffffffffffd0);
    *(float *)(in_RDX + 0x68b0) = (float)uVar5;
    *(float *)(in_RDI + 0xdc) = *(float *)(in_RDX + 0x68b0) + *(float *)(in_RDI + 0xdc);
  }
  return;
}

Assistant:

void predict(memory_tree& b, single_learner& base, example& ec)
    {  
        MULTICLASS::label_t mc;
        uint32_t save_multi_pred = 0;
        MULTILABEL::labels multilabels;
        MULTILABEL::labels preds;
        if (b.oas == false){
            mc = ec.l.multi;
            save_multi_pred = ec.pred.multiclass;
        }
        else{
            multilabels = ec.l.multilabels;
            preds = ec.pred.multilabels;
        }


        uint32_t cn = 0;
        ec.l.simple = {-1.f, 1.f, 0.};
        while(b.nodes[cn].internal == 1){ //if it's internal{
            base.predict(ec, b.nodes[cn].base_router);
            uint32_t newcn = ec.pred.scalar < 0 ? b.nodes[cn].left : b.nodes[cn].right; //do not need to increment nl and nr.
            cn = newcn;
        }
        
        if(b.oas == false){
            ec.l.multi = mc; 
            ec.pred.multiclass = save_multi_pred;
        }
        else{
            ec.pred.multilabels = preds; 
            ec.l.multilabels = multilabels;
        }

        int64_t closest_ec = 0;
        if(b.oas == false){
            closest_ec = pick_nearest(b, base, cn, ec);
            if (closest_ec != -1)
                ec.pred.multiclass = b.examples[closest_ec]->l.multi.label;
            else
                ec.pred.multiclass = 0;
            
            if (ec.l.multi.label != ec.pred.multiclass){
                ec.loss = ec.weight;
                b.num_mistakes++;
            }
        }
        else{
            float reward = 0.f;
            closest_ec = pick_nearest(b, base, cn, ec); 
            if (closest_ec != -1){
                reward = F1_score_for_two_examples(ec, *b.examples[closest_ec]);
                b.F1_score += reward;
            }
            v_array<uint32_t> selected_labs = v_init<uint32_t>();
            ec.loss = compute_hamming_loss_via_oas(b, base, cn, ec, selected_labs);
            b.hamming_loss += ec.loss;
        }
    }